

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_fma.cpp
# Opt level: O3

void ncnn::crop_pack4_sse(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  int iVar6;
  undefined8 *puVar7;
  int iVar8;
  
  iVar1 = dst->h;
  if (0 < iVar1) {
    iVar2 = dst->w;
    puVar7 = (undefined8 *)dst->data;
    iVar3 = src->w;
    puVar5 = (undefined8 *)
             ((long)src->data + (long)(left << 2) * 4 + (long)top * (long)iVar3 * src->elemsize);
    iVar6 = 0;
    do {
      iVar8 = iVar2;
      if (0 < iVar2) {
        do {
          uVar4 = puVar5[1];
          *puVar7 = *puVar5;
          puVar7[1] = uVar4;
          puVar5 = puVar5 + 2;
          puVar7 = puVar7 + 2;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      puVar5 = puVar5 + ((long)iVar3 - (long)iVar2) * 2;
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar1);
  }
  return;
}

Assistant:

static void crop_pack4_sse(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 4;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }

        ptr += (left + right) * 4;
    }
}